

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

bool __thiscall Lowerer::GenerateFastStackArgumentsLdElemI(Lowerer *this,Instr *ldElem)

{
  Opnd *this_00;
  RegOpnd *indexOpnd;
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  undefined4 *puVar4;
  IndirOpnd *src;
  
  this_00 = ldElem->m_src1;
  OVar2 = IR::Opnd::GetKind(this_00);
  if (OVar2 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar3) goto LAB_005ec9e7;
    *puVar4 = 0;
  }
  indexOpnd = *(RegOpnd **)&this_00[1].m_valueType;
  if (indexOpnd != (RegOpnd *)0x0) {
    bVar3 = IR::Opnd::IsTaggedInt(&indexOpnd->super_Opnd);
    if (bVar3) goto LAB_005ec981;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar4 = 1;
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                     ,0x5623,"(indexOpnd && indexOpnd->IsTaggedInt())",
                     "indexOpnd && indexOpnd->IsTaggedInt()");
  if (!bVar3) {
LAB_005ec9e7:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar4 = 0;
LAB_005ec981:
  bVar3 = Func::IsInlinee(ldElem->m_func);
  if (bVar3) {
    src = GetArgsIndirOpndForInlinee(this,ldElem,&indexOpnd->super_Opnd);
    InsertMove(ldElem->m_dst,&src->super_Opnd,ldElem,true);
  }
  else {
    GenerateLoadStackArgumentByIndex
              (this,ldElem->m_dst,indexOpnd,ldElem,*(int *)&this_00[2]._vptr_Opnd + 1,this->m_func);
  }
  IR::Instr::Remove(ldElem);
  return false;
}

Assistant:

bool
Lowerer::GenerateFastStackArgumentsLdElemI(IR::Instr* ldElem)
{
    //  MOV dst, ebp [(valueOpnd + 5) *4]  // 5 for the stack layout
    //

    IR::IndirOpnd *indirOpnd = ldElem->GetSrc1()->AsIndirOpnd();
    // Now load the index and check if it is an integer.
    IR::RegOpnd   *indexOpnd = indirOpnd->GetIndexOpnd();
    Assert (indexOpnd && indexOpnd->IsTaggedInt());

    if(ldElem->m_func->IsInlinee())
    {
        IR::IndirOpnd *argIndirOpnd = GetArgsIndirOpndForInlinee(ldElem, indexOpnd);

        Lowerer::InsertMove(ldElem->GetDst(), argIndirOpnd, ldElem);
    }
    else
    {
        GenerateLoadStackArgumentByIndex(ldElem->GetDst(), indexOpnd, ldElem, indirOpnd->GetOffset() + 1, m_func); // +1 to offset 'this'
    }

    ldElem->Remove();
    return false;
}